

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O1

int Vec_IntPushUniqueOrder(Vec_Int_t *p,int Entry)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int *piVar4;
  long lVar5;
  int iVar6;
  
  uVar1 = p->nSize;
  if (0 < (long)(int)uVar1) {
    lVar5 = 0;
    do {
      if (p->pArray[lVar5] == Entry) {
        return uVar1;
      }
      lVar5 = lVar5 + 1;
    } while ((int)uVar1 != lVar5);
  }
  uVar2 = p->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(0x40);
      }
      else {
        piVar4 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar2 * 2;
      if (iVar6 <= (int)uVar2) goto LAB_005e94b8;
      if (p->pArray == (int *)0x0) {
        piVar4 = (int *)malloc((ulong)uVar2 << 3);
      }
      else {
        piVar4 = (int *)realloc(p->pArray,(ulong)uVar2 << 3);
      }
      p->pArray = piVar4;
    }
    if (piVar4 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p->nCap = iVar6;
  }
LAB_005e94b8:
  lVar5 = (long)p->nSize;
  p->nSize = p->nSize + 1;
  if (0 < lVar5) {
    piVar4 = p->pArray;
    do {
      iVar6 = piVar4[lVar5 + -1];
      if (iVar6 <= Entry) goto LAB_005e94e6;
      piVar4[lVar5] = iVar6;
      bVar3 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar3);
    lVar5 = 0;
  }
LAB_005e94e6:
  p->pArray[(int)lVar5] = Entry;
  return (int)lVar5;
}

Assistant:

static inline int Vec_IntPushUniqueOrder( Vec_Int_t * p, int Entry )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrder( p, Entry );
    return 0;
}